

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_basic.c
# Opt level: O2

void test_new_delete(char *dir,char *file,vmemcache_repl_p repl_p)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  size_t sVar4;
  FILE *__stream;
  size_t sStack_1030;
  char local_1028 [4];
  char acStack_1024 [4];
  char nonexistent [4096];
  
  uVar2 = vmemcache_new();
  vmemcache_set_size(uVar2,0x100000);
  vmemcache_set_extent_size(uVar2,0x100);
  vmemcache_set_eviction_policy(uVar2,repl_p);
  iVar1 = vmemcache_add(uVar2,dir);
  if (iVar1 == 0) {
    vmemcache_delete(uVar2);
    uVar2 = vmemcache_new();
    vmemcache_set_size(uVar2,0x100000);
    vmemcache_set_extent_size(uVar2,0x100000);
    vmemcache_set_eviction_policy(uVar2,repl_p);
    iVar1 = vmemcache_add(uVar2,dir);
    if (iVar1 != 0) {
      uVar2 = 0xe3;
      goto LAB_00103991;
    }
    vmemcache_delete(uVar2);
    uVar2 = vmemcache_new();
    iVar1 = vmemcache_set_extent_size(uVar2,1);
    if (iVar1 == 0) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,0xeb,"test_new_delete");
      pcVar3 = "vmemcache_set_extent_size did not fail with extent_size == 1";
LAB_00103c0b:
      sStack_1030 = 0x3c;
LAB_00103c0d:
      fwrite(pcVar3,sStack_1030,1,_stderr);
      goto LAB_00103c19;
    }
    vmemcache_delete(uVar2);
    uVar2 = vmemcache_new();
    vmemcache_set_size(uVar2,0x100000);
    iVar1 = vmemcache_set_extent_size(uVar2,0xffffffffffffffff);
    if (iVar1 == 0) {
      iVar1 = vmemcache_add(uVar2,dir);
      if (iVar1 != 0) goto LAB_0010371e;
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,0xf4,"test_new_delete");
      pcVar3 = "vmemcache_new did not fail with extent_size == -1";
      sStack_1030 = 0x31;
      goto LAB_00103c0d;
    }
LAB_0010371e:
    vmemcache_delete(uVar2);
    uVar2 = vmemcache_new();
    iVar1 = vmemcache_set_extent_size(uVar2,0xff);
    if (iVar1 == 0) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,0xfc,"test_new_delete");
      pcVar3 = "vmemcache_new did not fail with extent_size == VMEMCACHE_MIN_EXTENT - 1";
      sStack_1030 = 0x47;
      goto LAB_00103c0d;
    }
    vmemcache_delete(uVar2);
    uVar2 = vmemcache_new();
    vmemcache_set_size(uVar2,0x100000);
    iVar1 = vmemcache_set_extent_size(uVar2,0x100001);
    if (iVar1 == 0) {
      iVar1 = vmemcache_add(uVar2,dir);
      if (iVar1 == 0) {
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                ,0x105,"test_new_delete");
        pcVar3 = "vmemcache_new did not fail with extent_size == max_size + 1";
        sStack_1030 = 0x3b;
        goto LAB_00103c0d;
      }
    }
    vmemcache_delete(uVar2);
    uVar2 = vmemcache_new();
    iVar1 = vmemcache_set_size(uVar2,0xfffff);
    if (iVar1 == 0) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,0x10d,"test_new_delete");
      pcVar3 = "vmemcache_new did not fail with size == VMEMCACHE_MIN_POOL - 1";
      sStack_1030 = 0x3e;
      goto LAB_00103c0d;
    }
    vmemcache_delete(uVar2);
    uVar2 = vmemcache_new();
    iVar1 = vmemcache_set_size(uVar2,1);
    if (iVar1 == 0) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,0x114,"test_new_delete");
      pcVar3 = "vmemcache_new did not fail with size == 1";
      sStack_1030 = 0x29;
      goto LAB_00103c0d;
    }
    vmemcache_delete(uVar2);
    uVar2 = vmemcache_new();
    iVar1 = vmemcache_set_size(uVar2,0xffffffffffffffff);
    if (iVar1 == 0) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,0x11b,"test_new_delete");
      pcVar3 = "vmemcache_new did not fail with size == -1";
      sStack_1030 = 0x2a;
      goto LAB_00103c0d;
    }
    vmemcache_delete(uVar2);
    uVar2 = vmemcache_new();
    vmemcache_set_size(uVar2,0x100000);
    vmemcache_set_extent_size(uVar2,0x100);
    vmemcache_set_eviction_policy(uVar2,repl_p);
    iVar1 = vmemcache_add(uVar2,file);
    if (iVar1 == 0) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,0x125,"test_new_delete");
      pcVar3 = "vmemcache_new did not fail with a file instead of a directory";
      sStack_1030 = 0x3d;
      goto LAB_00103c0d;
    }
    pcVar3 = (char *)vmemcache_errormsg();
    iVar1 = strcmp(pcVar3,"open: Not a directory");
    if (iVar1 == 0) {
      vmemcache_delete(uVar2);
      uVar2 = vmemcache_new();
      vmemcache_set_size(uVar2,0x100000);
      vmemcache_set_extent_size(uVar2,0x100);
      vmemcache_set_eviction_policy(uVar2,repl_p);
      iVar1 = vmemcache_add(uVar2,0);
      if (iVar1 == 0) {
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                ,0x134,"test_new_delete");
        pcVar3 = "vmemcache_new did not fail with a NULL directory path";
        sStack_1030 = 0x35;
        goto LAB_00103c0d;
      }
      pcVar3 = (char *)vmemcache_errormsg();
      iVar1 = strcmp(pcVar3,"invalid (NULL) path");
      if (iVar1 == 0) {
        vmemcache_delete(uVar2);
        uVar2 = vmemcache_new();
        vmemcache_set_size(uVar2,0x100000);
        vmemcache_set_extent_size(uVar2,0x100);
        vmemcache_set_eviction_policy(uVar2,repl_p);
        strcpy(local_1028,dir);
        sVar4 = strlen(local_1028);
        builtin_strncpy(local_1028 + sVar4,"/non",4);
        builtin_strncpy(acStack_1024 + sVar4,"exis",4);
        builtin_strncpy(nonexistent + sVar4,"tent_dir",9);
        iVar1 = vmemcache_add(uVar2,local_1028);
        if (iVar1 != 0) {
          vmemcache_delete(uVar2);
          return;
        }
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                ,0x146,"test_new_delete");
        pcVar3 = "vmemcache_new did not fail with a nonexistent directory path";
        goto LAB_00103c0b;
      }
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,0x139,"test_new_delete");
      __stream = _stderr;
      uVar2 = vmemcache_errormsg();
      pcVar3 = "wrong error message: \'%s\' (should be \'invalid (NULL) path\')";
    }
    else {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,0x12a,"test_new_delete");
      __stream = _stderr;
      uVar2 = vmemcache_errormsg();
      pcVar3 = "wrong error message: \'%s\' (should be \'open: Not a directory\')";
    }
  }
  else {
    uVar2 = 0xd9;
LAB_00103991:
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,uVar2,"test_new_delete");
    __stream = _stderr;
    uVar2 = vmemcache_errormsg();
    pcVar3 = "vmemcache_new: %s";
  }
  fprintf(__stream,pcVar3,uVar2);
LAB_00103c19:
  fputc(10,_stderr);
  abort();
}

Assistant:

static void
test_new_delete(const char *dir, const char *file, enum vmemcache_repl_p repl_p)
{
	VMEMcache *cache;

	/* TEST #1 - minimum values of max_size and extent_size */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (vmemcache_add(cache, dir))
		UT_FATAL("vmemcache_new: %s", vmemcache_errormsg());

	vmemcache_delete(cache);

	/* TEST #2 - extent_size = max_size = VMEMCACHE_MIN_POOL */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (vmemcache_add(cache, dir))
		UT_FATAL("vmemcache_new: %s", vmemcache_errormsg());

	vmemcache_delete(cache);

	/* TEST #3 - extent_size == 1 */
	cache = vmemcache_new();
	if (!vmemcache_set_extent_size(cache, 1))
		UT_FATAL(
			"vmemcache_set_extent_size did not fail with extent_size == 1");

	vmemcache_delete(cache);

	/* TEST #4 - extent_size == -1 */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	if (!vmemcache_set_extent_size(cache, (size_t)-1) &&
		!vmemcache_add(cache, dir)) {
		UT_FATAL("vmemcache_new did not fail with extent_size == -1");
	}
	vmemcache_delete(cache);

	/* TEST #5 - extent_size == VMEMCACHE_MIN_EXTENT - 1 */
	cache = vmemcache_new();
	if (!vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT - 1))
		UT_FATAL(
			"vmemcache_new did not fail with extent_size == VMEMCACHE_MIN_EXTENT - 1");
	vmemcache_delete(cache);

	/* TEST #6 - extent_size == max_size + 1 */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	if (!vmemcache_set_extent_size(cache, VMEMCACHE_MIN_POOL + 1) &&
		!vmemcache_add(cache, dir)) {
		UT_FATAL(
			"vmemcache_new did not fail with extent_size == max_size + 1");
	}
	vmemcache_delete(cache);

	/* TEST #7 - size == VMEMCACHE_MIN_POOL - 1 */
	cache = vmemcache_new();
	if (!vmemcache_set_size(cache, VMEMCACHE_MIN_POOL - 1))
		UT_FATAL(
			"vmemcache_new did not fail with size == VMEMCACHE_MIN_POOL - 1");
	vmemcache_delete(cache);

	/* TEST #8 - size == 1 */
	cache = vmemcache_new();
	if (!vmemcache_set_size(cache, 1))
		UT_FATAL(
			"vmemcache_new did not fail with size == 1");
	vmemcache_delete(cache);

	/* TEST #9 - size == -1 */
	cache = vmemcache_new();
	if (!vmemcache_set_size(cache, (size_t)-1))
		UT_FATAL(
			"vmemcache_new did not fail with size == -1");
	vmemcache_delete(cache);

	/* TEST #10 - not a directory, but a file */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (!vmemcache_add(cache, file))
		UT_FATAL(
			"vmemcache_new did not fail with a file instead of a directory");

#define ERR_MSG_1 "open: Not a directory"
	if (strcmp(vmemcache_errormsg(), ERR_MSG_1))
		UT_FATAL("wrong error message: '%s' (should be '"ERR_MSG_1"')",
			vmemcache_errormsg());
	vmemcache_delete(cache);

	/* TEST #11 - NULL directory path */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (!vmemcache_add(cache, NULL))
		UT_FATAL(
			"vmemcache_new did not fail with a NULL directory path");

#define ERR_MSG_2 "invalid (NULL) path"
	if (strcmp(vmemcache_errormsg(), ERR_MSG_2))
		UT_FATAL("wrong error message: '%s' (should be '"ERR_MSG_2"')",
			vmemcache_errormsg());
	vmemcache_delete(cache);

	/* TEST #12 - nonexistent directory path */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	char nonexistent[PATH_MAX];
	strcpy(nonexistent, dir);
	strcat(nonexistent, "/nonexistent_dir");
	if (!vmemcache_add(cache, nonexistent))
		UT_FATAL(
			"vmemcache_new did not fail with a nonexistent directory path");
	vmemcache_delete(cache);
}